

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool deqp::egl::Image::isCompatibleCreateAndRenderActions(Action *create,Action *render)

{
  bool bVar1;
  GLenum format;
  long local_80;
  long local_70;
  long local_60;
  long local_50;
  Create *local_40;
  GLenum createFormat;
  Create *gles2Create;
  Action *render_local;
  Action *create_local;
  
  if (create == (Action *)0x0) {
    local_40 = (Create *)0x0;
  }
  else {
    local_40 = (Create *)__dynamic_cast(create,&Action::typeinfo,&GLES2ImageApi::Create::typeinfo,0)
    ;
  }
  if (local_40 == (Create *)0x0) {
    create_local._7_1_ = false;
  }
  else {
    format = GLES2ImageApi::Create::getEffectiveFormat(local_40);
    if (render == (Action *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = __dynamic_cast(render,&Action::typeinfo,&GLES2ImageApi::RenderTexture2D::typeinfo,0
                               );
    }
    if ((local_50 == 0) ||
       ((bVar1 = isDepthFormat(format), !bVar1 && (bVar1 = isStencilFormat(format), !bVar1)))) {
      if (render == (Action *)0x0) {
        local_60 = 0;
      }
      else {
        local_60 = __dynamic_cast(render,&Action::typeinfo,
                                  &GLES2ImageApi::RenderReadPixelsRenderbuffer::typeinfo,0);
      }
      if ((local_60 == 0) ||
         ((bVar1 = isDepthFormat(format), !bVar1 && (bVar1 = isStencilFormat(format), !bVar1)))) {
        if (render == (Action *)0x0) {
          local_70 = 0;
        }
        else {
          local_70 = __dynamic_cast(render,&Action::typeinfo,
                                    &GLES2ImageApi::RenderDepthbuffer::typeinfo,0);
        }
        if ((local_70 == 0) || (bVar1 = isDepthFormat(format), bVar1)) {
          if (render == (Action *)0x0) {
            local_80 = 0;
          }
          else {
            local_80 = __dynamic_cast(render,&Action::typeinfo,
                                      &GLES2ImageApi::RenderStencilbuffer::typeinfo,0);
          }
          if ((local_80 == 0) || (bVar1 = isStencilFormat(format), bVar1)) {
            create_local._7_1_ = true;
          }
          else {
            create_local._7_1_ = false;
          }
        }
        else {
          create_local._7_1_ = false;
        }
      }
      else {
        create_local._7_1_ = false;
      }
    }
    else {
      create_local._7_1_ = false;
    }
  }
  return create_local._7_1_;
}

Assistant:

bool isCompatibleCreateAndRenderActions (const Action& create, const Action& render)
{
	if (const GLES2ImageApi::Create* gles2Create = dynamic_cast<const GLES2ImageApi::Create*>(&create))
	{
		const GLenum createFormat = gles2Create->getEffectiveFormat();

		if (dynamic_cast<const GLES2ImageApi::RenderTexture2D*>(&render))
		{
			// GLES2 does not have depth or stencil textures
			if (isDepthFormat(createFormat) || isStencilFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::RenderReadPixelsRenderbuffer*>(&render))
		{
			// GLES2 does not support readPixels for depth or stencil
			if (isDepthFormat(createFormat) || isStencilFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::RenderDepthbuffer*>(&render))
		{
			// Copying non-depth data to depth renderbuffer and expecting meaningful
			// results just doesn't make any sense.
			if (!isDepthFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::RenderStencilbuffer*>(&render))
		{
			// Copying non-stencil data to stencil renderbuffer and expecting meaningful
			// results just doesn't make any sense.
			if (!isStencilFormat(createFormat))
				return false;
		}

		return true;
	}
	else
		DE_ASSERT(false);

	return false;
}